

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

void __thiscall
llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Reset
          (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this)

{
  char *pcVar1;
  void *pvVar2;
  reference ppvVar3;
  
  DeallocateCustomSizedSlabs(this);
  (this->CustomSizedSlabs).super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
  super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>.
  super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.super_SmallVectorBase.Size
       = 0;
  if ((this->Slabs).super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>.
      super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Size != 0) {
    this->BytesAllocated = 0;
    ppvVar3 = SmallVectorTemplateCommon<void_*,_void>::front
                        ((SmallVectorTemplateCommon<void_*,_void> *)&this->Slabs);
    pcVar1 = (char *)*ppvVar3;
    this->CurPtr = pcVar1;
    this->End = pcVar1 + 0x1000;
    pvVar2 = (this->Slabs).super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>
             .super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX;
    DeallocateSlabs(this,(iterator)((long)pvVar2 + 8),
                    (iterator)
                    ((long)pvVar2 +
                    (ulong)(this->Slabs).super_SmallVectorImpl<void_*>.
                           super_SmallVectorTemplateBase<void_*,_true>.
                           super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Size
                    * 8));
    pvVar2 = (this->Slabs).super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>
             .super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX;
    SmallVectorImpl<void_*>::erase
              (&(this->Slabs).super_SmallVectorImpl<void_*>,(const_iterator)((long)pvVar2 + 8),
               (const_iterator)
               ((long)pvVar2 +
               (ulong)(this->Slabs).super_SmallVectorImpl<void_*>.
                      super_SmallVectorTemplateBase<void_*,_true>.
                      super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Size * 8))
    ;
    return;
  }
  return;
}

Assistant:

void Reset() {
    // Deallocate all but the first slab, and deallocate all custom-sized slabs.
    DeallocateCustomSizedSlabs();
    CustomSizedSlabs.clear();

    if (Slabs.empty())
      return;

    // Reset the state.
    BytesAllocated = 0;
    CurPtr = (char *)Slabs.front();
    End = CurPtr + SlabSize;

    __asan_poison_memory_region(*Slabs.begin(), computeSlabSize(0));
    DeallocateSlabs(std::next(Slabs.begin()), Slabs.end());
    Slabs.erase(std::next(Slabs.begin()), Slabs.end());
  }